

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers
          (ConversionStream *this,iterator *Token,SamplerHashType *SamplersHash)

{
  bool bVar1;
  bool bVar2;
  pointer pHVar3;
  Char *Message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_bool>_&&>::value,_pair<iterator,_bool>_>
  _Var4;
  bool local_1e9;
  String local_1e0;
  undefined1 local_1c0 [8];
  string err_3;
  _Self local_198;
  String local_190;
  undefined1 local_170 [8];
  string err_2;
  _Self local_148;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_140;
  undefined1 local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_130;
  String *local_108;
  String *SamplerName;
  undefined1 local_e0 [8];
  string err_1;
  undefined1 local_a0 [8];
  string err;
  bool local_71;
  String *pSStack_70;
  bool bIsComparison;
  String *SamplerType;
  byte local_59;
  int local_58;
  bool IsFunctionArgumentList;
  Uint32 ScopeDepth;
  undefined1 local_48 [8];
  string msg;
  SamplerHashType *SamplersHash_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  local_1e9 = true;
  if (pHVar3->Type != OpenParen) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    local_1e9 = true;
    if (pHVar3->Type != OpenBrace) {
      msg.field_2._8_8_ =
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::begin(&this->m_Tokens);
      local_1e9 = std::operator==(Token,(_Self *)((long)&msg.field_2 + 8));
    }
  }
  if (((local_1e9 ^ 0xffU) & 1) != 0) {
    FormatString<char[26],char[104]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin()"
               ,(char (*) [104])pHVar3);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ParseSamplers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x4b2);
    std::__cxx11::string::~string((string *)local_48);
  }
  local_58 = 1;
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  local_59 = pHVar3->Type == OpenParen;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
LAB_00414f04:
  SamplerType = (String *)
                std::__cxx11::
                list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                ::end(&this->m_Tokens);
  bVar1 = std::operator!=(Token,(_Self *)&SamplerType);
  if (bVar1 && local_58 != 0) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if ((pHVar3->Type == OpenParen) ||
       (pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
       pHVar3->Type == OpenBrace)) {
      local_58 = local_58 + 1;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    }
    else {
      pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if ((pHVar3->Type == ClosingParen) ||
         (pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
         pHVar3->Type == ClosingBrace)) {
        local_58 = local_58 + -1;
        if (local_58 == 0) goto LAB_004154e8;
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
      }
      else {
        pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        if (((pHVar3->Type == kw_SamplerState) ||
            (pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
            pHVar3->Type == kw_SamplerComparisonState)) && (local_58 == 1)) {
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          pSStack_70 = &pHVar3->Literal;
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          local_71 = pHVar3->Type == kw_SamplerComparisonState;
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
          do {
            err.field_2._8_8_ =
                 std::__cxx11::
                 list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                 ::end(&this->m_Tokens);
            bVar1 = std::operator!=(Token,(_Self *)((long)&err.field_2 + 8));
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              FormatString<char[19],std::__cxx11::string,char[13]>
                        ((string *)local_a0,(Diligent *)"Unexpected EOF in ",
                         (char (*) [19])pSStack_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xc3bfed,(char (*) [13])in_R8);
              PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                        ((String *)((long)&err_1.field_2 + 8),this,Token,4);
              in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
              LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                        (false,"ParseSamplers",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0x4dd,in_R8,(char (*) [2])0xc39489,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&err_1.field_2 + 8));
              std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)local_a0);
            }
            pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
            if (pHVar3->Type != Identifier) {
              FormatString<char[23],std::__cxx11::string,char[13]>
                        ((string *)local_e0,(Diligent *)"Missing identifier in ",
                         (char (*) [23])pSStack_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xc3bfed,(char (*) [13])in_R8);
              PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                        ((String *)&SamplerName,this,Token,4);
              in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
              LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                        (false,"ParseSamplers",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0x4de,in_R8,(char (*) [2])0xc39489,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &SamplerName);
              std::__cxx11::string::~string((string *)&SamplerName);
              std::__cxx11::string::~string((string *)local_e0);
            }
            pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
            local_108 = &pHVar3->Literal;
            std::make_pair<std::__cxx11::string_const&,bool&>(&local_130,local_108,&local_71);
            _Var4 = std::
                    unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                    ::insert<std::pair<std::__cxx11::string,bool>>
                              ((unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                                *)SamplersHash,&local_130);
            local_140._M_cur =
                 (__node_type *)
                 _Var4.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                 ._M_cur;
            local_138 = _Var4.second;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
            ::~pair(&local_130);
            std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
            if ((local_59 & 1) != 0) break;
            while( true ) {
              local_148._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                   ::end(&this->m_Tokens);
              bVar2 = std::operator!=(Token,&local_148);
              bVar1 = false;
              if (bVar2) {
                pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
                bVar1 = false;
                if (pHVar3->Type != Comma) {
                  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
                  bVar1 = pHVar3->Type != Semicolon;
                }
              }
              if (!bVar1) break;
              std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
            }
            err_2.field_2._8_8_ =
                 std::__cxx11::
                 list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                 ::end(&this->m_Tokens);
            bVar1 = std::operator!=(Token,(_Self *)((long)&err_2.field_2 + 8));
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              FormatString<char[30],std::__cxx11::string,char[13]>
                        ((string *)local_170,(Diligent *)"Unexpected EOF while parsing ",
                         (char (*) [30])pSStack_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xc3bfed,(char (*) [13])in_R8);
              PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                        (&local_190,this,Token,4);
              in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170
              ;
              LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                        (false,"ParseSamplers",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0x4f8,in_R8,(char (*) [2])0xc39489,&local_190);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)local_170);
            }
            pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
            if (pHVar3->Type != Comma) break;
            std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
            local_198._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                 ::end(&this->m_Tokens);
            bVar1 = std::operator!=(Token,&local_198);
          } while (bVar1);
        }
        else {
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
        }
      }
    }
    goto LAB_00414f04;
  }
LAB_004154e8:
  if (local_58 == 1) {
    err_3.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator==(Token,(_Self *)((long)&err_3.field_2 + 8));
    bVar1 = true;
    if (bVar2) goto LAB_00415541;
  }
  bVar1 = local_58 == 0;
LAB_00415541:
  if (!bVar1) {
    FormatString<char[20]>((string *)local_1c0,(char (*) [20])"Error parsing scope");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_1e0,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseSamplers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x50d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0
               ,(char (*) [2])0xc39489,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)local_1c0);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers(TokenListType::iterator& Token, SamplerHashType& SamplersHash)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin());
    Uint32 ScopeDepth             = 1;
    bool   IsFunctionArgumentList = Token->Type == TokenType::OpenParen;

    // Skip scope start symbol, which is either open bracket or m_Tokens.begin()
    ++Token;
    while (Token != m_Tokens.end() && ScopeDepth > 0)
    {
        if (Token->Type == TokenType::OpenParen ||
            Token->Type == TokenType::OpenBrace)
        {
            // Increase scope depth
            ++ScopeDepth;
            ++Token;
        }
        else if (Token->Type == TokenType::ClosingParen ||
                 Token->Type == TokenType::ClosingBrace)
        {
            // Decrease scope depth
            --ScopeDepth;
            if (ScopeDepth == 0)
                break;
            ++Token;
        }
        else if ((Token->Type == TokenType::kw_SamplerState ||
                  Token->Type == TokenType::kw_SamplerComparisonState) &&
                 // ONLY parse sampler states in the current scope, skip
                 // all nested scopes
                 ScopeDepth == 1)
        {
            const auto& SamplerType   = Token->Literal;
            bool        bIsComparison = Token->Type == TokenType::kw_SamplerComparisonState;
            // SamplerState LinearClamp;
            // ^
            ++Token;

            // There may be a number of samplers declared after single
            // Sampler[Comparison]State keyword:
            // SamplerState Tex2D1_sampler, Tex2D2_sampler;
            do
            {
                // SamplerState LinearClamp;
                //              ^
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", SamplerType, " declaration");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing identifier in ", SamplerType, " declaration");
                const auto& SamplerName = Token->Literal;

                // Add sampler state into the hash map
                SamplersHash.insert(std::make_pair(SamplerName, bIsComparison));

                ++Token;
                // SamplerState LinearClamp ;
                //                          ^

                // We cannot just remove sampler declarations, because samplers can
                // be passed to functions as arguments.
                // SamplerState and SamplerComparisonState are #defined as int, so all
                // sampler variables will just be unused global variables or function parameters.
                // Hopefully GLSL compiler will be able to optimize them out.

                if (IsFunctionArgumentList)
                {
                    // In function argument list, every argument
                    // has its own type declaration
                    break;
                }

                // Go to the next sampler declaration or statement end
                while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    ++Token;
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing ", SamplerType, " declaration");

                if (Token->Type == TokenType::Comma)
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                            ^
                    ++Token;
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                              ^
                }
                else
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                                             ^
                    break;
                }
            } while (Token != m_Tokens.end());
        }
        else
            ++Token;
    }
    VERIFY_PARSER_STATE(Token, (ScopeDepth == 1 && Token == m_Tokens.end()) || ScopeDepth == 0, "Error parsing scope");
}